

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMessageClearingCode
          (StringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor FVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  byte bVar4;
  char *format_00;
  Formatter format;
  Formatter local_50;
  
  local_50.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_50.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  pFVar2 = (this->super_FieldGenerator).descriptor_;
  FVar1 = pFVar2[1];
  if (((byte)FVar1 & 2) == 0) {
    if ((((byte)FVar1 & 0x60) == 0x20) && (*(char *)(*(long *)(pFVar2 + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar1 & 0x10) == 0) || (*(long *)(pFVar2 + 0x28) == 0)) goto LAB_002eb8ca;
    }
    else if (((byte)FVar1 & 0x60) == 0x40) goto LAB_002eb8ca;
    bVar4 = 0;
  }
  else {
LAB_002eb8ca:
    bVar4 = *(byte *)(*(long *)(pFVar2 + 0x38) + 0x4f) ^ 1;
  }
  if ((bVar4 != 0) && (this->inlined_ != false)) {
    Formatter::operator()<>(&local_50,"$DCHK$(!$name$_.IsDefault(nullptr));\n");
  }
  pcVar3 = "$name$_.ClearToEmpty();\n";
  if (bVar4 != 0) {
    pcVar3 = "$name$_.ClearNonDefaultToEmpty();\n";
  }
  format_00 = "$name$_.ClearToDefault($lazy_variable$, GetArenaForAllocation());\n ";
  if (*(long *)(*(long *)((this->super_FieldGenerator).descriptor_ + 0x40) + 8) == 0) {
    format_00 = pcVar3;
  }
  Formatter::operator()<>(&local_50,format_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50.vars_._M_t);
  return;
}

Assistant:

void StringFieldGenerator::GenerateMessageClearingCode(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have a hasbit, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against the default variable.
  const bool must_be_present = HasHasbit(descriptor_);

  if (inlined_ && must_be_present) {
    // Calling mutable_$name$() gives us a string reference and sets the has bit
    // for $name$ (in proto2).  We may get here when the string field is inlined
    // but the string's contents have not been changed by the user, so we cannot
    // make an assertion about the contents of the string and could never make
    // an assertion about the string instance.
    //
    // For non-inlined strings, we distinguish from non-default by comparing
    // instances, rather than contents.
    format("$DCHK$(!$name$_.IsDefault(nullptr));\n");
  }

  if (descriptor_->default_value_string().empty()) {
    if (must_be_present) {
      format("$name$_.ClearNonDefaultToEmpty();\n");
    } else {
      format("$name$_.ClearToEmpty();\n");
    }
  } else {
    // Clear to a non-empty default is more involved, as we try to use the
    // Arena if one is present and may need to reallocate the string.
    format(
        "$name$_.ClearToDefault($lazy_variable$, GetArenaForAllocation());\n ");
  }
}